

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3BtreeEnter(Btree *p)

{
  Btree *pBVar1;
  int iVar2;
  BtShared *pBVar3;
  Btree **ppBVar4;
  Btree **ppBVar5;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    pBVar3 = p->pBt;
    if (pBVar3->mutex != (sqlite3_mutex *)0x0) {
      iVar2 = (*sqlite3Config.mutex.xMutexTry)(pBVar3->mutex);
      if (iVar2 != 0) {
        ppBVar4 = &p->pNext;
        ppBVar5 = ppBVar4;
        while (pBVar1 = *ppBVar5, pBVar1 != (Btree *)0x0) {
          if (pBVar1->locked != '\0') {
            unlockBtreeMutex(pBVar1);
          }
          ppBVar5 = &pBVar1->pNext;
        }
        lockBtreeMutex(p);
        while (pBVar1 = *ppBVar4, pBVar1 != (Btree *)0x0) {
          if (pBVar1->wantToLock != 0) {
            lockBtreeMutex(pBVar1);
          }
          ppBVar4 = &pBVar1->pNext;
        }
        return;
      }
      pBVar3 = p->pBt;
    }
    pBVar3->db = p->db;
    p->locked = '\x01';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeEnter(Btree *p){
  Btree *pLater;

  /* Some basic sanity checking on the Btree.  The list of Btrees
  ** connected by pNext and pPrev should be in sorted order by
  ** Btree.pBt value. All elements of the list should belong to
  ** the same connection. Only shared Btrees are on the list. */
  assert( p->pNext==0 || p->pNext->pBt>p->pBt );
  assert( p->pPrev==0 || p->pPrev->pBt<p->pBt );
  assert( p->pNext==0 || p->pNext->db==p->db );
  assert( p->pPrev==0 || p->pPrev->db==p->db );
  assert( p->sharable || (p->pNext==0 && p->pPrev==0) );

  /* Check for locking consistency */
  assert( !p->locked || p->wantToLock>0 );
  assert( p->sharable || p->wantToLock==0 );

  /* We should already hold a lock on the database connection */
  assert( sqlite3_mutex_held(p->db->mutex) );

  /* Unless the database is sharable and unlocked, then BtShared.db
  ** should already be set correctly. */
  assert( (p->locked==0 && p->sharable) || p->pBt->db==p->db );

  if( !p->sharable ) return;
  p->wantToLock++;
  if( p->locked ) return;

  /* In most cases, we should be able to acquire the lock we
  ** want without having to go throught the ascending lock
  ** procedure that follows.  Just be sure not to block.
  */
  if( sqlite3_mutex_try(p->pBt->mutex)==SQLITE_OK ){
    p->pBt->db = p->db;
    p->locked = 1;
    return;
  }

  /* To avoid deadlock, first release all locks with a larger
  ** BtShared address.  Then acquire our lock.  Then reacquire
  ** the other BtShared locks that we used to hold in ascending
  ** order.
  */
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    assert( pLater->sharable );
    assert( pLater->pNext==0 || pLater->pNext->pBt>pLater->pBt );
    assert( !pLater->locked || pLater->wantToLock>0 );
    if( pLater->locked ){
      unlockBtreeMutex(pLater);
    }
  }
  lockBtreeMutex(p);
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    if( pLater->wantToLock ){
      lockBtreeMutex(pLater);
    }
  }
}